

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_credits.hpp
# Opt level: O3

uint32_t __thiscall PatchCredits::inject_func_choose_ending_palette(PatchCredits *this,ROM *rom)

{
  uint32_t uVar1;
  initializer_list<md::DataRegister> __l;
  initializer_list<md::AddressRegister> __l_00;
  initializer_list<md::DataRegister> __l_01;
  initializer_list<md::AddressRegister> __l_02;
  initializer_list<md::DataRegister> __l_03;
  initializer_list<md::AddressRegister> __l_04;
  AddressInRegister ret;
  Code func;
  allocator_type local_13a;
  allocator_type local_139;
  undefined1 local_138 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_118;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> local_100;
  AddressRegister local_e8;
  undefined **local_d8;
  undefined1 local_d0;
  Code local_c8;
  ROM *local_48;
  AddressRegister local_40;
  
  local_c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  local_c8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c8._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  local_c8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c8._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_e8.super_Register._code = '\x01';
  local_e8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262c50;
  local_138._0_8_ = &PTR_getXn_00262cd8;
  local_138._8_8_ = 0x200ff0080;
  local_c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_c8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  md::Code::lea(&local_c8,(Param *)local_138,&local_e8);
  local_e8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262cd8;
  local_e8.super_Register._8_8_ = 0x200ff001c;
  local_138._0_8_ = &PTR_getXn_00262c98;
  local_138._8_8_ = 2;
  local_48 = rom;
  md::Code::cmpi(&local_c8,(ImmediateValue *)local_138,(Param *)&local_e8,BYTE);
  local_138._0_8_ = &local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"not_arg","");
  md::Code::bne(&local_c8,(string *)local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._0_8_ != &local_128) {
    operator_delete((void *)local_138._0_8_,local_128._M_allocated_capacity + 1);
  }
  local_e8.super_Register._8_8_ = local_e8.super_Register._8_8_ & 0xffffffffffffff00;
  local_e8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262c50;
  local_138._0_8_ = &PTR_getXn_00262cd8;
  local_138._12_4_ = 2;
  local_138._8_4_ = this->_red_credits_palette_addr;
  md::Code::lea(&local_c8,(Param *)local_138,&local_e8);
  local_138._0_8_ = &local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"ret","");
  md::Code::bra(&local_c8,(string *)local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._0_8_ != &local_128) {
    operator_delete((void *)local_138._0_8_,local_128._M_allocated_capacity + 1);
  }
  local_138._0_8_ = &local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"not_arg","");
  md::Code::label(&local_c8,(string *)local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._0_8_ != &local_128) {
    operator_delete((void *)local_138._0_8_,local_128._M_allocated_capacity + 1);
  }
  local_138._8_8_ = local_138._8_8_ & 0xffffffffffffff00;
  local_138._0_8_ = &PTR_getXn_00262be0;
  local_128._M_local_buf[8] = 1;
  local_128._M_allocated_capacity = (size_type)&PTR_getXn_00262be0;
  __l._M_len = 2;
  __l._M_array = (iterator)local_138;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            (&local_100,__l,&local_139);
  local_e8.super_Register._8_8_ = local_e8.super_Register._8_8_ & 0xffffffffffffff00;
  local_e8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262c50;
  local_d0 = 1;
  local_d8 = &PTR_getXn_00262c50;
  __l_00._M_len = 2;
  __l_00._M_array = &local_e8;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_118,__l_00,&local_13a);
  local_40.super_Register._code = '\a';
  local_40.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262c50;
  md::Code::movem(&local_c8,&local_100,&local_118,true,&local_40,LONG);
  if (local_118.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.
                    super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.
                    super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_100.
                          super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_100.
                          super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_e8.super_Register._8_8_ = local_e8.super_Register._8_8_ & 0xffffffffffffff00;
  local_e8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262c50;
  local_138._0_8_ = &PTR_getXn_00262cd8;
  local_138._8_8_ = 0x200ff1060;
  md::Code::lea(&local_c8,(Param *)local_138,&local_e8);
  local_e8.super_Register._code = 1;
  local_e8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262c50;
  local_138._0_8_ = &PTR_getXn_00262cd8;
  local_138._12_4_ = LONG;
  local_138._8_4_ = this->_all_checks_bytes_addr;
  md::Code::lea(&local_c8,(Param *)local_138,&local_e8);
  local_138._0_8_ = &local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"checks_loop","");
  md::Code::label(&local_c8,(string *)local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._0_8_ != &local_128) {
    operator_delete((void *)local_138._0_8_,local_128._M_allocated_capacity + 1);
  }
  local_138._0_8_ = &PTR_getXn_00262d18;
  local_128._M_allocated_capacity = local_128._M_allocated_capacity & 0xffffffffffffff00;
  local_138._8_8_ = &PTR_getXn_00262c50;
  local_128._8_2_ = 0;
  local_128._M_local_buf[10] = '\x03';
  local_e8.super_Register._8_8_ = local_e8.super_Register._8_8_ & 0xffffffffffffff00;
  local_e8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262be0;
  md::Code::move(&local_c8,(Param *)local_138,(Param *)&local_e8,WORD);
  local_138._0_8_ = &PTR_getXn_00262d18;
  local_128._M_local_buf[0] = 1;
  local_138._8_8_ = &PTR_getXn_00262c50;
  local_128._8_2_ = 0;
  local_128._M_local_buf[10] = '\x03';
  local_e8.super_Register._code = '\x01';
  local_e8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262be0;
  md::Code::move(&local_c8,(Param *)local_138,(Param *)&local_e8,WORD);
  local_138[8] = '\x01';
  local_138._0_8_ = &PTR_getXn_00262be0;
  local_e8.super_Register._code = '\0';
  local_e8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262be0;
  md::Code::and_to_dx(&local_c8,(Param *)local_138,(DataRegister *)&local_e8,WORD);
  local_138[8] = 1;
  local_138._0_8_ = &PTR_getXn_00262be0;
  local_e8.super_Register._8_8_ = (ulong)(uint7)local_e8.super_Register._9_7_ << 8;
  local_e8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262be0;
  md::Code::cmp(&local_c8,local_138,&local_e8);
  local_138._0_8_ = &local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"not_all_checks","");
  md::Code::bne(&local_c8,(string *)local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._0_8_ != &local_128) {
    operator_delete((void *)local_138._0_8_,local_128._M_allocated_capacity + 1);
  }
  local_e8.super_Register._8_8_ = local_e8.super_Register._8_8_ & 0xffffffffffffff00;
  local_e8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262c50;
  local_138._0_8_ = &PTR_getXn_00262c98;
  local_138._8_8_ = 0x200ff109c;
  md::Code::cmpa(&local_c8,(Param *)local_138,&local_e8);
  local_138._0_8_ = &local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"checks_loop","");
  md::Code::blt(&local_c8,(string *)local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._0_8_ != &local_128) {
    operator_delete((void *)local_138._0_8_,local_128._M_allocated_capacity + 1);
  }
  local_138._8_8_ = local_138._8_8_ & 0xffffffffffffff00;
  local_138._0_8_ = &PTR_getXn_00262be0;
  local_128._M_local_buf[8] = 1;
  local_128._M_allocated_capacity = (size_type)&PTR_getXn_00262be0;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)local_138;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            (&local_100,__l_01,&local_139);
  local_e8.super_Register._8_8_ = local_e8.super_Register._8_8_ & 0xffffffffffffff00;
  local_e8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262c50;
  local_d0 = 1;
  local_d8 = &PTR_getXn_00262c50;
  __l_02._M_len = 2;
  __l_02._M_array = &local_e8;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_118,__l_02,&local_13a);
  local_40.super_Register._code = '\a';
  local_40.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262c50;
  md::Code::movem(&local_c8,&local_100,&local_118,false,&local_40,LONG);
  if (local_118.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.
                    super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.
                    super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_100.
                          super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_100.
                          super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_e8.super_Register._8_8_ = local_e8.super_Register._8_8_ & 0xffffffffffffff00;
  local_e8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262c50;
  local_138._0_8_ = &PTR_getXn_00262cd8;
  local_138._12_4_ = 2;
  local_138._8_4_ = this->_gold_credits_palette_addr;
  md::Code::lea(&local_c8,(Param *)local_138,&local_e8);
  local_138._0_8_ = &local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"ret","");
  md::Code::bra(&local_c8,(string *)local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._0_8_ != &local_128) {
    operator_delete((void *)local_138._0_8_,local_128._M_allocated_capacity + 1);
  }
  local_138._0_8_ = &local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"not_all_checks","");
  md::Code::label(&local_c8,(string *)local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._0_8_ != &local_128) {
    operator_delete((void *)local_138._0_8_,local_128._M_allocated_capacity + 1);
  }
  local_138._8_8_ = local_138._8_8_ & 0xffffffffffffff00;
  local_138._0_8_ = &PTR_getXn_00262be0;
  local_128._M_local_buf[8] = 1;
  local_128._M_allocated_capacity = (size_type)&PTR_getXn_00262be0;
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)local_138;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            (&local_100,__l_03,&local_139);
  local_e8.super_Register._8_8_ = local_e8.super_Register._8_8_ & 0xffffffffffffff00;
  local_e8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262c50;
  local_d0 = 1;
  local_d8 = &PTR_getXn_00262c50;
  __l_04._M_len = 2;
  __l_04._M_array = &local_e8;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_118,__l_04,&local_13a);
  local_40.super_Register._code = '\a';
  local_40.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262c50;
  md::Code::movem(&local_c8,&local_100,&local_118,false,&local_40,LONG);
  if (local_118.super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.
                    super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<md::AddressRegister,_std::allocator<md::AddressRegister>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_100.super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_100.
                    super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_100.
                          super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_100.
                          super__Vector_base<md::DataRegister,_std::allocator<md::DataRegister>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_138._0_8_ = &PTR_getXn_00262cd8;
  local_138._8_8_ = 0x200ff107d;
  md::Code::btst(&local_c8,'\0',(Param *)local_138);
  local_138._0_8_ = &local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"ret","");
  md::Code::beq(&local_c8,(string *)local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._0_8_ != &local_128) {
    operator_delete((void *)local_138._0_8_,local_128._M_allocated_capacity + 1);
  }
  local_e8.super_Register._8_8_ = local_e8.super_Register._8_8_ & 0xffffffffffffff00;
  local_e8.super_Register.super_Param._vptr_Param = (_func_int **)&PTR_getXn_00262c50;
  local_138._0_8_ = &PTR_getXn_00262cd8;
  local_138._12_4_ = LONG;
  local_138._8_4_ = this->_blue_credits_palette_addr;
  md::Code::lea(&local_c8,(Param *)local_138,&local_e8);
  local_138._0_8_ = &local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"ret","");
  md::Code::label(&local_c8,(string *)local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._0_8_ != &local_128) {
    operator_delete((void *)local_138._0_8_,local_128._M_allocated_capacity + 1);
  }
  md::Code::rts(&local_c8);
  local_138._0_8_ = &local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"");
  uVar1 = md::ROM::inject_code(local_48,&local_c8,(string *)local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._0_8_ != &local_128) {
    operator_delete((void *)local_138._0_8_,local_128._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&local_c8._labels._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_c8._pending_branches._M_t);
  if (local_c8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8._bytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return uVar1;
}

Assistant:

uint32_t inject_func_choose_ending_palette(md::ROM& rom)
    {
        md::Code func;
        {
            func.lea(0xFF0080, reg_A1); // instruction erased by the jsr
            func.cmpib(2, addr_(0xFF001C));
            func.bne("not_arg");
            {
                func.lea(_red_credits_palette_addr, reg_A0); // Use red credits palette if Dark Gola has been beaten
                func.bra("ret");
            }
            func.label("not_arg");
            func.movem_to_stack({ reg_D0, reg_D1 }, { reg_A0, reg_A1 });
            func.lea(0xFF1060, reg_A0);
            func.lea(_all_checks_bytes_addr, reg_A1);
            func.label("checks_loop");
            {
                func.movew(addr_postinc_(reg_A0), reg_D0);  // A0/D0 = cursor on check flags
                func.movew(addr_postinc_(reg_A1), reg_D1);  // A1/D1 = cursor on target values
                func.andw(reg_D1, reg_D0);                  // Check if D0 contains at least all bits set in D1
                func.cmpw(reg_D1, reg_D0);
                func.bne("not_all_checks");                 // If at least one is not equal, don't give golden ending
                func.cmpa(0xFF109C, reg_A0);
                func.blt("checks_loop");
                func.movem_from_stack({ reg_D0, reg_D1 }, { reg_A0, reg_A1 });
                func.lea(_gold_credits_palette_addr, reg_A0); // Everything was collected, give the golden credits
                func.bra("ret");
            }

            func.label("not_all_checks");
            func.movem_from_stack({ reg_D0, reg_D1 }, { reg_A0, reg_A1 });
            func.btst(FLAG_USED_BLUE_RIBBON.bit, addr_(0xFF1000 + FLAG_USED_BLUE_RIBBON.byte));
            func.beq("ret");
            {
                func.lea(_blue_credits_palette_addr, reg_A0); // Use blue credits palette if blue ribbon is held
            }
            func.label("ret");
        }
        func.rts();
        return rom.inject_code(func);
    }